

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O0

DString * d_string_new(char *startingString)

{
  size_t __n;
  void *pvVar1;
  size_t startingStringSize;
  size_t startingBufferSize;
  DString *newString;
  char *startingString_local;
  
  startingString_local = (char *)malloc(0x18);
  if ((long *)startingString_local == (long *)0x0) {
    startingString_local = (char *)0x0;
  }
  else {
    newString = (DString *)startingString;
    if (startingString == (char *)0x0) {
      newString = (DString *)0x110c9a;
    }
    startingStringSize = 0x400;
    __n = strlen((char *)newString);
    for (; startingStringSize < __n + 1; startingStringSize = startingStringSize << 1) {
    }
    pvVar1 = malloc(startingStringSize);
    *(void **)startingString_local = pvVar1;
    if (*(long *)startingString_local == 0) {
      free(startingString_local);
      startingString_local = (char *)0x0;
    }
    else {
      *(size_t *)((long)startingString_local + 8) = startingStringSize;
      strncpy(*(char **)startingString_local,(char *)newString,__n);
      *(undefined1 *)(*(long *)startingString_local + __n) = 0;
      *(size_t *)((long)startingString_local + 0x10) = __n;
    }
  }
  return (DString *)startingString_local;
}

Assistant:

DString * d_string_new(const char * startingString) {
	DString * newString = malloc(sizeof(DString));

	if (!newString) {
		return NULL;
	}

	if (startingString == NULL) {
		startingString = "";
	}

	size_t startingBufferSize = kStringBufferStartingSize;
	size_t startingStringSize = strlen(startingString);

	while (startingBufferSize < (startingStringSize + 1)) {
		startingBufferSize *= kStringBufferGrowthMultiplier;
	}

	newString->str = malloc(startingBufferSize);

	if (!newString->str) {
		free(newString);
		return NULL;
	}

	newString->currentStringBufferSize = startingBufferSize;
	strncpy(newString->str, startingString, startingStringSize);
	newString->str[startingStringSize] = '\0';
	newString->currentStringLength = startingStringSize;

	return newString;
}